

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O3

void __thiscall
cmCTestSVN::GuessBase
          (cmCTestSVN *this,SVNInfo *svninfo,
          vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *changes)

{
  string *psVar1;
  size_type sVar2;
  pointer pCVar3;
  string *psVar4;
  bool bVar5;
  long lVar6;
  ostream *poVar7;
  pointer pCVar8;
  pointer pCVar9;
  bool bVar10;
  string base;
  string local_80;
  cmCTestSVN *local_60;
  string *local_58;
  string local_50;
  
  psVar1 = &svninfo->URL;
  local_60 = this;
  lVar6 = std::__cxx11::string::find((char)psVar1,0x2f);
  psVar4 = local_58;
  if (lVar6 != -1) {
    sVar2 = (svninfo->Base)._M_string_length;
    local_58 = psVar1;
    while (sVar2 == 0) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)psVar1);
      cmCTest::DecodeURL(&local_80,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pCVar3 = (changes->
               super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pCVar9 = (changes->
               super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pCVar3 != pCVar9 && (svninfo->Base)._M_string_length == 0) {
        do {
          pCVar8 = pCVar3 + 1;
          bVar5 = cmCTestSVNPathStarts
                            ((string *)(pCVar3->Path)._M_dataplus._M_p,
                             (string *)(pCVar3->Path)._M_string_length);
          bVar10 = true;
          if (bVar5) {
            std::__cxx11::string::_M_assign((string *)&svninfo->Base);
            pCVar9 = (changes->
                     super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            bVar10 = (svninfo->Base)._M_string_length == 0;
          }
        } while ((bVar10) && (pCVar3 = pCVar8, pCVar8 != pCVar9));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      psVar1 = local_58;
      lVar6 = std::__cxx11::string::find((char)local_58,0x2f);
      psVar4 = local_58;
      if (lVar6 == -1) break;
      sVar2 = (svninfo->Base)._M_string_length;
    }
  }
  local_58 = psVar4;
  std::__cxx11::string::append((char *)&svninfo->Base);
  poVar7 = (local_60->super_cmCTestGlobalVC).super_cmCTestVC.Log;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Guessed Base = ",0xf);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(svninfo->Base)._M_dataplus._M_p,(svninfo->Base)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  return;
}

Assistant:

void cmCTestSVN::GuessBase(SVNInfo& svninfo,
                           std::vector<Change> const& changes)
{
  // Subversion did not give us a good repository root so we need to
  // guess the base path from the URL and the paths in a revision with
  // changes under it.

  // Consider each possible URL suffix from longest to shortest.
  for (std::string::size_type slash = svninfo.URL.find('/');
       svninfo.Base.empty() && slash != std::string::npos;
       slash = svninfo.URL.find('/', slash + 1)) {
    // If the URL suffix is a prefix of at least one path then it is the base.
    std::string base = cmCTest::DecodeURL(svninfo.URL.substr(slash));
    for (auto ci = changes.begin();
         svninfo.Base.empty() && ci != changes.end(); ++ci) {
      if (cmCTestSVNPathStarts(ci->Path, base)) {
        svninfo.Base = base;
      }
    }
  }

  // We always append a slash so that we know paths beginning in the
  // base lie under its path.  If no base was found then the working
  // tree must be a checkout of the entire repo and this will match
  // the leading slash in all paths.
  svninfo.Base += "/";

  this->Log << "Guessed Base = " << svninfo.Base << "\n";
}